

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_coc_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  int iVar1;
  byte local_31;
  jpc_msparms_t *pjStack_30;
  uint_fast8_t tmp;
  jpc_coc_t *coc;
  jas_stream_t *in_local;
  jpc_cstate_t *cstate_local;
  jpc_ms_t *ms_local;
  
  pjStack_30 = &ms->parms;
  coc = (jpc_coc_t *)in;
  in_local = (jas_stream_t *)cstate;
  cstate_local = (jpc_cstate_t *)ms;
  if (cstate->numcomps < 0x101) {
    iVar1 = jpc_getuint8(in,&local_31);
    if (iVar1 != 0) {
      return -1;
    }
    *(ulong *)pjStack_30 = (ulong)local_31;
  }
  else {
    iVar1 = jpc_getuint16(in,(uint_fast16_t *)&pjStack_30->soc);
    if (iVar1 != 0) {
      return -1;
    }
  }
  iVar1 = jpc_getuint8((jas_stream_t *)coc,&(pjStack_30->rgn).roisty);
  if (iVar1 == 0) {
    iVar1 = jpc_cox_getcompparms
                      ((jpc_ms_t *)cstate_local,(jpc_cstate_t *)in_local,(jas_stream_t *)coc,
                       (uint)(((pjStack_30->coc).compparms.csty & 1) != 0),
                       &(pjStack_30->coc).compparms);
    if (iVar1 == 0) {
      if (((undefined1  [80])coc->compparms & (undefined1  [80])0x1) == (undefined1  [80])0x0) {
        ms_local._4_4_ = 0;
      }
      else {
        ms_local._4_4_ = -1;
      }
    }
    else {
      ms_local._4_4_ = -1;
    }
  }
  else {
    ms_local._4_4_ = -1;
  }
  return ms_local._4_4_;
}

Assistant:

static int jpc_coc_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_coc_t *coc = &ms->parms.coc;
	uint_fast8_t tmp;
	if (cstate->numcomps <= 256) {
		if (jpc_getuint8(in, &tmp)) {
			return -1;
		}
		coc->compno = tmp;
	} else {
		if (jpc_getuint16(in, &coc->compno)) {
			return -1;
		}
	}
	if (jpc_getuint8(in, &coc->compparms.csty)) {
		return -1;
	}
	if (jpc_cox_getcompparms(ms, cstate, in,
	  (coc->compparms.csty & JPC_COX_PRT) != 0, &coc->compparms)) {
		return -1;
	}
	if (jas_stream_eof(in)) {
		return -1;
	}
	return 0;
}